

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::ir::copyWithReplacedDest
          (ir *this,shared_ptr<mocker::ir::IRInst> *inst,shared_ptr<mocker::ir::Reg> *newDest)

{
  uint __line;
  shared_ptr<mocker::ir::Call> *psVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *__assertion;
  shared_ptr<mocker::ir::Addr> *arg;
  __shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *__args;
  ulong uVar4;
  shared_ptr<mocker::ir::IRInst> sVar5;
  shared_ptr<mocker::ir::Comment> p;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_b0;
  shared_ptr<mocker::ir::Call> p_13;
  shared_ptr<mocker::ir::Phi> p_14;
  long local_60;
  shared_ptr<mocker::ir::Label> label;
  value_type val;
  
  getOperandsUsed(&local_b0,inst);
  dyc<mocker::ir::Deleted,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
  peVar2 = p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (peVar2 != (element_type *)0x0) {
    if (local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assertion = "operands.empty()";
      __line = 0x4d;
LAB_001883e4:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,__line,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    std::make_shared<mocker::ir::Deleted>();
    _Var3 = p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    this_00 = &p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
    p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    goto LAB_00187fc6;
  }
  dyc<mocker::ir::Comment,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
  if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::AttachedComment,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "operands.empty()";
        __line = 0x55;
        goto LAB_001883e4;
      }
      std::make_shared<mocker::ir::AttachedComment,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_13);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "operands.empty()";
        __line = 0x59;
        goto LAB_001883e4;
      }
      std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Jump,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assertion = "operands.empty()";
        __line = 0x5d;
        goto LAB_001883e4;
      }
      std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>const&>
                ((shared_ptr<mocker::ir::Label> *)&p_13);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assertion = "operands.size() == 1";
        __line = 0x62;
        goto LAB_001883e4;
      }
      std::
      make_shared<mocker::ir::Assign,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(shared_ptr<mocker::ir::Addr> *)newDest);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assertion = "operands.size() == 1";
        __line = 0x66;
        goto LAB_001883e4;
      }
      p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,*(undefined4 *)
                           ((long)&((p.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->str).field_2 + 8));
      std::
      make_shared<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(OpType *)newDest,
                 (shared_ptr<mocker::ir::Addr> *)&p_14);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
        __assertion = "operands.size() == 2";
        __line = 0x6a;
        goto LAB_001883e4;
      }
      p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,*(undefined4 *)
                           ((long)&((p.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->str).field_2 + 8));
      std::
      make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(OpType *)newDest,
                 (shared_ptr<mocker::ir::Addr> *)&p_14,
                 local_b0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
        __assertion = "operands.size() == 2";
        __line = 0x6e;
        goto LAB_001883e4;
      }
      p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,*(undefined4 *)
                           ((long)&((p.
                                     super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->str).field_2 + 8));
      std::
      make_shared<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(OpType *)newDest,
                 (shared_ptr<mocker::ir::Addr> *)&p_14,
                 local_b0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
        __assertion = "operands.size() == 2";
        __line = 0x72;
        goto LAB_001883e4;
      }
      std::
      make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Addr> *)&p_13,
                 local_b0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assertion = "operands.size() == 1";
        __line = 0x76;
        goto LAB_001883e4;
      }
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(shared_ptr<mocker::ir::Addr> *)newDest);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Malloc,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assertion = "operands.size() == 1";
        __line = 0x7a;
        goto LAB_001883e4;
      }
      std::
      make_shared<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                ((shared_ptr<mocker::ir::Reg> *)&p_13,(shared_ptr<mocker::ir::Addr> *)newDest);
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Branch,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if ((long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b0.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x10) {
        __assertion = "operands.size() == 1";
        __line = 0x7e;
        goto LAB_001883e4;
      }
      std::
      make_shared<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>const&>
                ((shared_ptr<mocker::ir::Addr> *)&p_13,
                 (shared_ptr<mocker::ir::Label> *)
                 local_b0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (shared_ptr<mocker::ir::Label> *)
                 ((long)&((p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->str).field_2 + 8));
      goto LAB_00187fa7;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    dyc<mocker::ir::Ret,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p,inst);
    if (p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_13,inst);
      if (p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)&p_14,inst);
        if (p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x98,
                        "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                       );
        }
        if ((long)local_b0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 !=
            (long)((p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  options).
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)((p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  options).
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) {
          __assert_fail("operands.size() == p->getOptions().size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x8f,
                        "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                       );
        }
        p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_60 = 0;
        for (uVar4 = 0;
            uVar4 < (ulong)((long)local_b0.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_b0.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1
            ) {
          std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&val.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&((local_b0.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr + local_60));
          std::dynamic_pointer_cast<mocker::ir::Label,mocker::ir::Label>(&label);
          std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>::
          pair<std::shared_ptr<mocker::ir::Addr>_&,_std::shared_ptr<mocker::ir::Label>_&,_true>
                    ((pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *
                     )&p,(shared_ptr<mocker::ir::Addr> *)
                         &val.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>,
                     &label);
          std::
          vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
          ::
          emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
                    ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                      *)&p_13,(pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                               *)&p);
          std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>::~pair
                    ((pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *
                     )&p);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&label.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&val.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          local_60 = local_60 + 0x10;
        }
        std::
        make_shared<mocker::ir::Phi,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
                  ((shared_ptr<mocker::ir::Reg> *)&p,
                   (vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    *)newDest);
        _Var3 = p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)this =
             p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
        p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::
        vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
        ::~vector((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                   *)&p_13);
        this_00 = &p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      }
      else {
        if ((long)local_b0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_b0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)((p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)((p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  args).
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          __assert_fail("operands.size() == p->getArgs().size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x87,
                        "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                       );
        }
        p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::reserve((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   *)&p,(long)local_b0.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b0.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4);
        for (__args = &(local_b0.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
            __args != &(local_b0.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->
                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
            __args = __args + 1) {
          std::
          vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
          ::emplace_back<std::shared_ptr<mocker::ir::Addr>const&>
                    ((vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
                      *)&p,(shared_ptr<mocker::ir::Addr> *)__args);
        }
        std::
        make_shared<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>>
                  ((shared_ptr<mocker::ir::Reg> *)&p_14,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)newDest,
                   (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    *)&(p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->funcName);
        _Var3 = p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)this =
             p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
        p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        std::
        vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   *)&p);
        this_00 = &p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ;
      }
      goto LAB_00187fc6;
    }
    if (0x10 < (ulong)((long)local_b0.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b0.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      __assert_fail("operands.size() <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x82,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    if (local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_14.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      std::__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)&p_14,
                 &(local_b0.
                   super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::make_shared<mocker::ir::Ret,std::shared_ptr<mocker::ir::Addr>const>
              ((shared_ptr<mocker::ir::Addr> *)&p_13);
    _Var3 = p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
    p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar1 = (shared_ptr<mocker::ir::Call> *)&p_14;
  }
  else {
    if (local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assertion = "operands.empty()";
      __line = 0x51;
      goto LAB_001883e4;
    }
    std::make_shared<mocker::ir::Comment,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p_13);
LAB_00187fa7:
    _Var3._M_pi = p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    psVar1 = &p_13;
    p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this =
         p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var3._M_pi;
    p_13.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar1->super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            );
  this_00 = &p.super___shared_ptr<mocker::ir::Comment,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_00187fc6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&local_b0);
  sVar5.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar5.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IRInst>
copyWithReplacedDest(const std::shared_ptr<ir::IRInst> &inst,
                     const std::shared_ptr<ir::Reg> &newDest) {
  return copyWithReplacedDestAndOperands(inst, newDest, getOperandsUsed(inst));
}